

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice_main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Alice *pAVar1;
  int local_4c;
  code *local_48;
  undefined8 local_40;
  thread local_38;
  thread server_thread;
  Alice *local_20;
  Alice *A;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  A = (Alice *)argv;
  argv_local._0_4_ = argc;
  pAVar1 = (Alice *)operator_new(0x150);
  Alice::Alice(pAVar1);
  local_48 = Alice::GoLive;
  local_40 = 0;
  local_4c = 0x4bc;
  local_20 = pAVar1;
  std::thread::thread<int(Alice::*)(int),Alice*&,int,void>
            (&local_38,(type *)&local_48,&local_20,&local_4c);
  std::thread::join();
  pAVar1 = local_20;
  if (local_20 != (Alice *)0x0) {
    Alice::~Alice(local_20);
    operator_delete(pAVar1,0x150);
  }
  argv_local._4_4_ = 0;
  std::thread::~thread(&local_38);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char const *argv[]) 
{ 
	Alice *A = new Alice();;
	std::thread server_thread(&Alice::GoLive, A, PORT);
	server_thread.join();
	delete A;
	return 0; 
}